

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void helper_fsave_x86_64(CPUX86State *env,target_ulong ptr,int data32)

{
  ulong uVar1;
  int iVar2;
  target_ulong ptr_00;
  floatx80 f;
  uintptr_t unaff_retaddr;
  
  do_fstenv(env,ptr,data32,unaff_retaddr);
  ptr_00 = (long)(0xe << ((byte)data32 & 0x1f)) + ptr;
  for (iVar2 = 0; iVar2 != 8; iVar2 = iVar2 + 1) {
    uVar1 = (ulong)((env->fpstt + iVar2 & 7) << 4);
    f._8_4_ = *(undefined4 *)((long)env->fpregs + uVar1 + 8);
    f.low = *(undefined8 *)((long)env->fpregs + uVar1);
    f._12_4_ = 0;
    helper_fstt(env,f,ptr_00,unaff_retaddr);
    ptr_00 = ptr_00 + 10;
  }
  do_fninit(env);
  return;
}

Assistant:

void helper_fsave(CPUX86State *env, target_ulong ptr, int data32)
{
    floatx80 tmp;
    int i;

    do_fstenv(env, ptr, data32, GETPC());

    ptr += (14 << data32);
    for (i = 0; i < 8; i++) {
        tmp = ST(i);
        helper_fstt(env, tmp, ptr, GETPC());
        ptr += 10;
    }

    do_fninit(env);
}